

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::EndBindFunction(ByteCodeGenerator *this,bool funcExprWithName)

{
  ScopeType SVar1;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  SVar1 = this->currentScope->scopeType;
  if ((SVar1 | ScopeType_GlobalEvalBlock) != ScopeType_FunctionBody) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x625,
                       "(currentScope->GetScopeType() == ScopeType_FunctionBody || isGlobalScope)",
                       "currentScope->GetScopeType() == ScopeType_FunctionBody || isGlobalScope");
    if (!bVar3) goto LAB_00831242;
    *puVar4 = 0;
  }
  PopScope(this);
  if (SVar1 == ScopeType_Global) {
    if (this->currentScope != (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x62a,"(currentScope == nullptr)","currentScope == nullptr");
      if (!bVar3) goto LAB_00831242;
      *puVar4 = 0;
    }
  }
  else {
    if (this->currentScope->scopeType != ScopeType_Parameter) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x62e,"(currentScope->GetScopeType() == ScopeType_Parameter)",
                         "currentScope->GetScopeType() == ScopeType_Parameter");
      if (!bVar3) goto LAB_00831242;
      *puVar4 = 0;
    }
    PopScope(this);
  }
  if (funcExprWithName) {
    if (this->currentScope->scopeType != ScopeType_FuncExpr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x634,"(currentScope->GetScopeType() == ScopeType_FuncExpr)",
                         "currentScope->GetScopeType() == ScopeType_FuncExpr");
      if (!bVar3) {
LAB_00831242:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    PopScope(this);
  }
  this_00 = this->funcInfoStack;
  SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
            (&this_00->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&this_00->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>,
             this_00->allocator);
  return;
}

Assistant:

void ByteCodeGenerator::EndBindFunction(bool funcExprWithName)
{
    bool isGlobalScope = currentScope->GetScopeType() == ScopeType_Global;

    Assert(currentScope->GetScopeType() == ScopeType_FunctionBody || isGlobalScope);
    PopScope(); // function body

    if (isGlobalScope)
    {
        Assert(currentScope == nullptr);
    }
    else
    {
        Assert(currentScope->GetScopeType() == ScopeType_Parameter);
        PopScope(); // parameter scope
    }

    if (funcExprWithName)
    {
        Assert(currentScope->GetScopeType() == ScopeType_FuncExpr);
        PopScope();
    }

    funcInfoStack->Pop();
}